

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void FuzzTest1(void)

{
  voffset_t vVar1;
  uoffset_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  Table *table_00;
  voffset_t vStack_9d24;
  voffset_t off_1;
  int choice_1;
  int f_1;
  Table *table;
  int i_1;
  uint8_t *eob;
  voffset_t vStack_9d00;
  voffset_t off;
  int choice;
  int f;
  int local_9cec;
  uoffset_t start;
  int i;
  uoffset_t objects [10000];
  FlatBufferBuilder builder;
  int num_fuzz_objects;
  int fields_per_object;
  int test_values_max;
  double double_val;
  float float_val;
  uint64_t ulong_val;
  int64_t long_val;
  uint32_t uint_val;
  int32_t int_val;
  uint16_t ushort_val;
  int16_t short_val;
  uint8_t uchar_val;
  int8_t char_val;
  uint8_t bool_val;
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder((FlatBufferBuilder *)(objects + 0x270e),0x400);
  lcg_reset();
  for (local_9cec = 0; local_9cec < 10000; local_9cec = local_9cec + 1) {
    uVar2 = flatbuffers::FlatBufferBuilder::StartTable((FlatBufferBuilder *)(objects + 0x270e));
    for (_vStack_9d00 = 0; _vStack_9d00 < 4; _vStack_9d00 = _vStack_9d00 + 1) {
      uVar3 = lcg_rand();
      vVar1 = flatbuffers::FieldIndexToOffset(vStack_9d00);
      switch(uVar3 % 0xb) {
      case 0:
        flatbuffers::FlatBufferBuilder::AddElement<unsigned_char>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,'\x01','\0');
        break;
      case 1:
        flatbuffers::FlatBufferBuilder::AddElement<signed_char>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,-0x7f,'\0');
        break;
      case 2:
        flatbuffers::FlatBufferBuilder::AddElement<unsigned_char>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,0xff,'\0');
        break;
      case 3:
        flatbuffers::FlatBufferBuilder::AddElement<short>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,-0x7dde,0);
        break;
      case 4:
        flatbuffers::FlatBufferBuilder::AddElement<unsigned_short>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,0xfeee,0);
        break;
      case 5:
        flatbuffers::FlatBufferBuilder::AddElement<int>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,-0x7ccccccd,0);
        break;
      case 6:
        flatbuffers::FlatBufferBuilder::AddElement<unsigned_int>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,0xfddddddd,0);
        break;
      case 7:
        flatbuffers::FlatBufferBuilder::AddElement<long>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,-0x7bbbbbbbbbbbbbbc,0);
        break;
      case 8:
        flatbuffers::FlatBufferBuilder::AddElement<unsigned_long>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,0xfccccccccccccccc,0);
        break;
      case 9:
        flatbuffers::FlatBufferBuilder::AddElement<float>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,3.14159,0.0);
        break;
      case 10:
        flatbuffers::FlatBufferBuilder::AddElement<double>
                  ((FlatBufferBuilder *)(objects + 0x270e),vVar1,3.14159265359,0.0);
      }
    }
    uVar2 = flatbuffers::FlatBufferBuilder::EndTable
                      ((FlatBufferBuilder *)(objects + 0x270e),uVar2,4);
    (&start)[local_9cec] = uVar2;
  }
  flatbuffers::FlatBufferBuilder::PreAlign<unsigned_long>((FlatBufferBuilder *)(objects + 0x270e),0)
  ;
  lcg_reset();
  puVar4 = flatbuffers::FlatBufferBuilder::GetBufferPointer((FlatBufferBuilder *)(objects + 0x270e))
  ;
  uVar2 = flatbuffers::FlatBufferBuilder::GetSize((FlatBufferBuilder *)(objects + 0x270e));
  for (table._4_4_ = 0; table._4_4_ < 10000; table._4_4_ = table._4_4_ + 1) {
    table_00 = (Table *)(puVar4 + ((ulong)uVar2 - (ulong)(&start)[table._4_4_]));
    for (_vStack_9d24 = 0; _vStack_9d24 < 4; _vStack_9d24 = _vStack_9d24 + 1) {
      uVar3 = lcg_rand();
      vVar1 = flatbuffers::FieldIndexToOffset(vStack_9d24);
      switch(uVar3 % 0xb) {
      case 0:
        CompareTableFieldValue<unsigned_char>(table_00,(uint)vVar1,'\x01');
        break;
      case 1:
        CompareTableFieldValue<signed_char>(table_00,(uint)vVar1,-0x7f);
        break;
      case 2:
        CompareTableFieldValue<unsigned_char>(table_00,(uint)vVar1,0xff);
        break;
      case 3:
        CompareTableFieldValue<short>(table_00,(uint)vVar1,-0x7dde);
        break;
      case 4:
        CompareTableFieldValue<unsigned_short>(table_00,(uint)vVar1,0xfeee);
        break;
      case 5:
        CompareTableFieldValue<int>(table_00,(uint)vVar1,-0x7ccccccd);
        break;
      case 6:
        CompareTableFieldValue<unsigned_int>(table_00,(uint)vVar1,0xfddddddd);
        break;
      case 7:
        CompareTableFieldValue<long>(table_00,(uint)vVar1,-0x7bbbbbbbbbbbbbbc);
        break;
      case 8:
        CompareTableFieldValue<unsigned_long>(table_00,(uint)vVar1,0xfccccccccccccccc);
        break;
      case 9:
        CompareTableFieldValue<float>(table_00,(uint)vVar1,3.14159);
        break;
      case 10:
        CompareTableFieldValue<double>(table_00,(uint)vVar1,3.14159265359);
      }
    }
  }
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder((FlatBufferBuilder *)(objects + 0x270e));
  return;
}

Assistant:

void FuzzTest1() {

  // Values we're testing against: chosen to ensure no bits get chopped
  // off anywhere, and also be different from eachother.
  const uint8_t  bool_val   = true;
  const int8_t   char_val   = -127;  // 0x81
  const uint8_t  uchar_val  = 0xFF;
  const int16_t  short_val  = -32222; // 0x8222;
  const uint16_t ushort_val = 0xFEEE;
  const int32_t  int_val    = 0x83333333;
  const uint32_t uint_val   = 0xFDDDDDDD;
  const int64_t  long_val   = 0x8444444444444444;
  const uint64_t ulong_val  = 0xFCCCCCCCCCCCCCCC;
  const float    float_val  = 3.14159f;
  const double   double_val = 3.14159265359;

  const int test_values_max = 11;
  const int fields_per_object = 4;
  const int num_fuzz_objects = 10000;  // The higher, the more thorough :)

  flatbuffers::FlatBufferBuilder builder;

  lcg_reset();  // Keep it deterministic.

  flatbuffers::uoffset_t objects[num_fuzz_objects];

  // Generate num_fuzz_objects random objects each consisting of
  // fields_per_object fields, each of a random type.
  for (int i = 0; i < num_fuzz_objects; i++) {
    auto start = builder.StartTable();
    for (int f = 0; f < fields_per_object; f++) {
      int choice = lcg_rand() % test_values_max;
      flatbuffers::voffset_t off = flatbuffers::FieldIndexToOffset(f);
      switch (choice) {
        case 0:  builder.AddElement<uint8_t >(off, bool_val,   0); break;
        case 1:  builder.AddElement<int8_t  >(off, char_val,   0); break;
        case 2:  builder.AddElement<uint8_t >(off, uchar_val,  0); break;
        case 3:  builder.AddElement<int16_t >(off, short_val,  0); break;
        case 4:  builder.AddElement<uint16_t>(off, ushort_val, 0); break;
        case 5:  builder.AddElement<int32_t >(off, int_val,    0); break;
        case 6:  builder.AddElement<uint32_t>(off, uint_val,   0); break;
        case 7:  builder.AddElement<int64_t >(off, long_val,   0); break;
        case 8:  builder.AddElement<uint64_t>(off, ulong_val,  0); break;
        case 9:  builder.AddElement<float   >(off, float_val,  0); break;
        case 10: builder.AddElement<double  >(off, double_val, 0); break;
      }
    }
    objects[i] = builder.EndTable(start, fields_per_object);
  }
  builder.PreAlign<flatbuffers::largest_scalar_t>(0);  // Align whole buffer.

  lcg_reset();  // Reset.

  uint8_t *eob = builder.GetBufferPointer() + builder.GetSize();

  // Test that all objects we generated are readable and return the
  // expected values. We generate random objects in the same order
  // so this is deterministic.
  for (int i = 0; i < num_fuzz_objects; i++) {
    auto table = reinterpret_cast<flatbuffers::Table *>(eob - objects[i]);
    for (int f = 0; f < fields_per_object; f++) {
      int choice = lcg_rand() % test_values_max;
      flatbuffers::voffset_t off = flatbuffers::FieldIndexToOffset(f);
      switch (choice) {
        case 0:  CompareTableFieldValue(table, off, bool_val  ); break;
        case 1:  CompareTableFieldValue(table, off, char_val  ); break;
        case 2:  CompareTableFieldValue(table, off, uchar_val ); break;
        case 3:  CompareTableFieldValue(table, off, short_val ); break;
        case 4:  CompareTableFieldValue(table, off, ushort_val); break;
        case 5:  CompareTableFieldValue(table, off, int_val   ); break;
        case 6:  CompareTableFieldValue(table, off, uint_val  ); break;
        case 7:  CompareTableFieldValue(table, off, long_val  ); break;
        case 8:  CompareTableFieldValue(table, off, ulong_val ); break;
        case 9:  CompareTableFieldValue(table, off, float_val ); break;
        case 10: CompareTableFieldValue(table, off, double_val); break;
      }
    }
  }
}